

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::DeadBranchElimPass::SimplifyBranch
          (DeadBranchElimPass *this,BasicBlock *block,uint32_t live_lab_id)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t loop_merge_id;
  uint32_t loop_continue_id;
  uint32_t switch_merge_id;
  Instruction *this_00;
  Instruction *inst;
  StructuredCFGAnalysis *this_01;
  Instruction *pIVar3;
  BasicBlock *block_00;
  Operand *__x;
  Instruction *pIVar4;
  IRContext *pIVar5;
  initializer_list<unsigned_int> init_list;
  uint32_t local_ac;
  Operand local_a8;
  OperandList new_operands;
  SmallVector<unsigned_int,_2UL> local_58;
  
  this_00 = BasicBlock::GetMergeInst(block);
  inst = BasicBlock::terminator(block);
  if ((this_00 == (Instruction *)0x0) || (this_00->opcode_ != OpSelectionMerge)) {
    AddBranch(this,live_lab_id,block);
    pIVar5 = (this->super_MemPass).super_Pass.context_;
  }
  else {
    pIVar3 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    pIVar4 = (Instruction *)0x0;
    if ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
      pIVar4 = pIVar3;
    }
    if (pIVar4->opcode_ == OpSwitch) {
      uVar2 = BasicBlock::id(block);
      bVar1 = SwitchHasNestedBreak(this,uVar2);
      if (bVar1) {
        uVar2 = Instruction::NumInOperands(inst);
        if (uVar2 != 2) {
          new_operands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          new_operands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          new_operands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          __x = Instruction::GetInOperand(inst,0);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    (&new_operands,__x);
          init_list._M_len = 1;
          init_list._M_array = &local_ac;
          local_ac = live_lab_id;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
          local_a8.type = 1;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a8.words,&local_58);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&new_operands,&local_a8);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a8.words);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
          Instruction::SetInOperands(inst,&new_operands);
          IRContext::UpdateDefUse((this->super_MemPass).super_Pass.context_,inst);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&new_operands);
          return true;
        }
        return false;
      }
    }
    this_01 = IRContext::GetStructuredCFGAnalysis((this->super_MemPass).super_Pass.context_);
    uVar2 = Instruction::GetSingleWordInOperand(this_00,0);
    loop_merge_id = StructuredCFGAnalysis::LoopMergeBlock(this_01,live_lab_id);
    loop_continue_id = StructuredCFGAnalysis::LoopContinueBlock(this_01,live_lab_id);
    switch_merge_id = StructuredCFGAnalysis::SwitchMergeBlock(this_01,live_lab_id);
    pIVar3 = FindFirstExitFromSelectionMerge
                       (this,live_lab_id,uVar2,loop_merge_id,loop_continue_id,switch_merge_id);
    AddBranch(this,live_lab_id,block);
    IRContext::KillInst((this->super_MemPass).super_Pass.context_,inst);
    if (pIVar3 != (Instruction *)0x0) {
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
                (&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
      local_a8._0_8_ = this_00;
      Instruction::InsertBefore
                (pIVar3,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&local_a8);
      if ((Instruction *)local_a8._0_8_ != (Instruction *)0x0) {
        (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_a8._0_8_)->_vptr_IntrusiveNodeBase
          [1])();
      }
      pIVar5 = (this->super_MemPass).super_Pass.context_;
      block_00 = IRContext::get_instr_block(pIVar5,pIVar3);
      IRContext::set_instr_block(pIVar5,this_00,block_00);
      return true;
    }
    pIVar5 = (this->super_MemPass).super_Pass.context_;
    inst = this_00;
  }
  IRContext::KillInst(pIVar5,inst);
  return true;
}

Assistant:

bool DeadBranchElimPass::SimplifyBranch(BasicBlock* block,
                                        uint32_t live_lab_id) {
  Instruction* merge_inst = block->GetMergeInst();
  Instruction* terminator = block->terminator();
  if (merge_inst && merge_inst->opcode() == spv::Op::OpSelectionMerge) {
    if (merge_inst->NextNode()->opcode() == spv::Op::OpSwitch &&
        SwitchHasNestedBreak(block->id())) {
      if (terminator->NumInOperands() == 2) {
        // We cannot remove the branch, and it already has a single case, so no
        // work to do.
        return false;
      }
      // We have to keep the switch because it has a nest break, so we
      // remove all cases except for the live one.
      Instruction::OperandList new_operands;
      new_operands.push_back(terminator->GetInOperand(0));
      new_operands.push_back({SPV_OPERAND_TYPE_ID, {live_lab_id}});
      terminator->SetInOperands(std::move(new_operands));
      context()->UpdateDefUse(terminator);
    } else {
      // Check if the merge instruction is still needed because of a
      // non-nested break from the construct.  Move the merge instruction if
      // it is still needed.
      StructuredCFGAnalysis* cfg_analysis =
          context()->GetStructuredCFGAnalysis();
      Instruction* first_break = FindFirstExitFromSelectionMerge(
          live_lab_id, merge_inst->GetSingleWordInOperand(0),
          cfg_analysis->LoopMergeBlock(live_lab_id),
          cfg_analysis->LoopContinueBlock(live_lab_id),
          cfg_analysis->SwitchMergeBlock(live_lab_id));

      AddBranch(live_lab_id, block);
      context()->KillInst(terminator);
      if (first_break == nullptr) {
        context()->KillInst(merge_inst);
      } else {
        merge_inst->RemoveFromList();
        first_break->InsertBefore(std::unique_ptr<Instruction>(merge_inst));
        context()->set_instr_block(merge_inst,
                                   context()->get_instr_block(first_break));
      }
    }
  } else {
    AddBranch(live_lab_id, block);
    context()->KillInst(terminator);
  }
  return true;
}